

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

bool duckdb::Linenoise::IsSpace(char c)

{
  return (bool)((byte)(0x100002600 >> (c & 0x3fU)) & (byte)c < 0x21);
}

Assistant:

bool Linenoise::IsSpace(char c) {
	switch (c) {
	case ' ':
	case '\r':
	case '\n':
	case '\t':
		return true;
	default:
		return false;
	}
}